

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O1

void vector_erase(vector v,size_t position)

{
  size_t sVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  void *__src;
  ulong uVar5;
  void *__dest;
  ulong uVar6;
  
  if ((v != (vector)0x0) && (uVar5 = v->size, position < uVar5)) {
    if (position < uVar5 - 1) {
      sVar1 = v->type_size;
      pvVar2 = v->data;
      if (pvVar2 == (void *)0x0) {
        __dest = (void *)0x0;
      }
      else {
        uVar4 = sVar1 * position;
        uVar6 = v->capacity * sVar1;
        __dest = (void *)0x0;
        if (uVar4 <= uVar6 && uVar6 - uVar4 != 0) {
          __dest = (void *)((long)pvVar2 + uVar4);
        }
      }
      if (pvVar2 == (void *)0x0) {
        __src = (void *)0x0;
      }
      else {
        uVar4 = (position + 1) * sVar1;
        uVar6 = v->capacity * sVar1;
        __src = (void *)0x0;
        if (uVar4 <= uVar6 && uVar6 - uVar4 != 0) {
          __src = (void *)((long)pvVar2 + uVar4);
        }
      }
      memmove(__dest,__src,sVar1 * (uVar5 + ~position));
    }
    uVar5 = v->size - 1;
    v->size = uVar5;
    if ((v->capacity >> 3 < uVar5) && (iVar3 = vector_reserve(v,uVar5 * 2), iVar3 != 0)) {
      log_write_impl_va("metacall",0x1cb,"vector_erase",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,3,"Vector reserve error");
      return;
    }
  }
  return;
}

Assistant:

void vector_erase(vector v, size_t position)
{
	if (v != NULL && position < v->size)
	{
		if (position < v->size - 1)
		{
			memmove(vector_data_offset_bytes(v, position * v->type_size),
				vector_data_offset_bytes(v, (position + 1) * v->type_size),
				(v->size - position - 1) * v->type_size);
		}

		--v->size;

		if (v->capacity / VECTOR_CAPACITY_MIN_USED < v->size)
		{
			if (vector_reserve(v, v->size * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");
			}
		}
	}
}